

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::TracingServiceImpl::ConsumerEndpointImpl::ObserveEvents
          (ConsumerEndpointImpl *this,uint32_t events_mask)

{
  TracingSession *tracing_session;
  ProducerEndpointImpl *producer;
  _Rb_tree_node_base *p_Var1;
  
  this->observable_events_mask_ = events_mask;
  tracing_session = GetTracingSession(this->service_,this->tracing_session_id_);
  if (tracing_session != (TracingSession *)0x0) {
    if ((events_mask & 1) != 0) {
      for (p_Var1 = (tracing_session->data_source_instances)._M_t._M_impl.super__Rb_tree_header.
                    _M_header._M_left;
          (_Rb_tree_header *)p_Var1 !=
          &(tracing_session->data_source_instances)._M_t._M_impl.super__Rb_tree_header;
          p_Var1 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var1)) {
        producer = GetProducer(this->service_,(short)p_Var1[1]._M_color);
        OnDataSourceInstanceStateChange(this,producer,(DataSourceInstance *)&p_Var1[1]._M_parent);
      }
    }
    if ((this->observable_events_mask_ & 2) != 0) {
      MaybeNotifyAllDataSourcesStarted(this->service_,tracing_session);
      return;
    }
  }
  return;
}

Assistant:

void TracingServiceImpl::ConsumerEndpointImpl::ObserveEvents(
    uint32_t events_mask) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  observable_events_mask_ = events_mask;
  TracingSession* session = service_->GetTracingSession(tracing_session_id_);
  if (!session)
    return;

  if (observable_events_mask_ & ObservableEvents::TYPE_DATA_SOURCES_INSTANCES) {
    // Issue initial states.
    for (const auto& kv : session->data_source_instances) {
      ProducerEndpointImpl* producer = service_->GetProducer(kv.first);
      PERFETTO_DCHECK(producer);
      OnDataSourceInstanceStateChange(*producer, kv.second);
    }
  }

  // If the ObserveEvents() call happens after data sources have acked already
  // notify immediately.
  if (observable_events_mask_ &
      ObservableEvents::TYPE_ALL_DATA_SOURCES_STARTED) {
    service_->MaybeNotifyAllDataSourcesStarted(session);
  }
}